

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::VarSlice::VarSlice(VarSlice *this,Var *parent,uint32_t high,uint32_t low)

{
  initializer_list<unsigned_int> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  VarType VVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  uint32_t *puVar6;
  undefined4 extraout_var_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  undefined4 extraout_var_01;
  remove_reference_t<std::__cxx11::basic_string<char>_> *prVar8;
  undefined4 extraout_var_02;
  size_type sVar9;
  reference pvVar10;
  VarException *this_00;
  VarSlice *pVVar11;
  char (*format_str) [81];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar12;
  format_args args_00;
  string_view format_str_00;
  long *local_3b0;
  bool local_22d;
  ulong local_200;
  uint64_t i_1;
  uint32_t base_width_1;
  VarSlice *slice;
  uint64_t i;
  uint32_t base_width;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  allocator<unsigned_int> local_1a9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  uint local_174;
  iterator local_170;
  undefined8 local_168;
  undefined1 local_15a;
  allocator<const_kratos::IRNode_*> local_159;
  Var *local_158;
  Var **local_150;
  size_type local_148;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_140;
  v7 local_128 [32];
  string local_108;
  bool local_e1;
  uint32_t local_e0;
  bool dropped_dim_size1;
  uint32_t p_d;
  bool diff_parent;
  uint32_t diff;
  allocator<char> local_c1;
  string local_c0;
  uint32_t local_a0;
  uint32_t local_9c;
  uint32_t low_local;
  uint32_t high_local;
  Var *parent_local;
  VarSlice *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0 = low;
  local_9c = high;
  _low_local = parent;
  parent_local = &this->super_Var;
  iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  puVar6 = Var::var_width(_low_local);
  args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)(ulong)*puVar6;
  aVar12.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar3),&local_c0,*puVar6,1,false,
           Slice);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0059d650;
  this->parent_var = _low_local;
  this->low = local_a0;
  this->high = local_9c;
  this->var_high_ = 0;
  this->var_low_ = 0;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            (&this->op_,&local_9c,&local_a0);
  this->struct_ = (PackedStruct *)0x0;
  p_d = num_size_decrease(_low_local);
  dropped_dim_size1 = true;
  if (((local_a0 == 0) && (local_9c == 0)) && (VVar4 = Var::type(_low_local), VVar4 == Slice)) {
    local_e0 = num_size_decrease((Var *)_low_local[1].super_IRNode._vptr_IRNode);
    dropped_dim_size1 = p_d != local_e0;
  }
  local_22d = false;
  if ((local_a0 == 0) && (local_22d = false, local_9c == 0)) {
    iVar3 = (*(_low_local->super_IRNode)._vptr_IRNode[0x29])();
    pvVar7 = Var::size((Var *)CONCAT44(extraout_var_00,iVar3));
    args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    local_22d = false;
    if ((remove_reference_t<std::__cxx11::basic_string<char>_> *)0x1 < args) {
      iVar3 = (*(_low_local->super_IRNode)._vptr_IRNode[0x29])();
      pvVar7 = Var::size((Var *)CONCAT44(extraout_var_01,iVar3));
      args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(pvVar7);
      local_22d = false;
      if ((*(value_type *)args == 1) && (local_22d = false, (dropped_dim_size1 & 1U) != 0)) {
        prVar8 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)(ulong)p_d;
        iVar3 = (*(_low_local->super_IRNode)._vptr_IRNode[0x29])();
        pvVar7 = Var::size((Var *)CONCAT44(extraout_var_02,iVar3));
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
        args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)(sVar9 - 1);
        local_22d = prVar8 == args;
      }
    }
  }
  local_e1 = local_22d;
  pvVar7 = Var::size(_low_local);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
  if (sVar9 == 1) {
    pvVar7 = Var::size(_low_local);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
    if ((*pvVar10 == 1) && (bVar2 = Var::explicit_array(_low_local), bVar2)) {
      if ((local_9c != 0) || (local_a0 != 0)) {
        local_15a = 1;
        this_00 = (VarException *)__cxa_allocate_exception(0x10);
        (*(_low_local->super_IRNode)._vptr_IRNode[0x1f])(local_128);
        local_38 = &local_108;
        local_40 = 
        "Parent {0} is a scalar but used marked as an explicit array, only [0, 0] allowed";
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_128;
        local_68.named_args.data =
             (named_arg_info<char> *)
             fmt::v7::make_args_checked<std::__cxx11::string,char[81],char>
                       ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)
                        "Parent {0} is a scalar but used marked as an explicit array, only [0, 0] allowed"
                        ,(v7 *)vargs,format_str,args);
        local_50 = &local_68;
        local_78 = fmt::v7::to_string_view<char,_0>(local_40);
        local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&this_local;
        local_30 = local_50;
        local_20 = local_50;
        local_10 = local_50;
        local_18 = local_28;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0xd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)&local_50->string);
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = aVar12.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_80.values_;
        format_str_00.size_ = (size_t)this_local;
        format_str_00.data_ = (char *)local_78.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_108,(detail *)local_78.data_,format_str_00,args_00);
        local_158 = _low_local;
        local_150 = &local_158;
        local_148 = 1;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_159);
        __l_00._M_len = local_148;
        __l_00._M_array = (iterator)local_150;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_140,__l_00,&local_159);
        VarException::VarException(this_00,&local_108,&local_140);
        local_15a = 0;
        __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
      }
      goto LAB_0020a8d9;
    }
  }
  pvVar7 = Var::size(_low_local);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
  if (sVar9 == 1) {
    pvVar7 = Var::size(_low_local);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
    if ((*pvVar10 == 1) && ((local_e1 & 1U) == 0)) {
      (this->super_Var).var_width_ = (local_9c - local_a0) + 1;
      iVar3 = (*(_low_local->super_IRNode)._vptr_IRNode[0x18])();
      (this->super_Var).is_packed_ = (bool)((byte)iVar3 & 1);
      goto LAB_0020a8d9;
    }
  }
  pvVar7 = Var::size(_low_local);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
  if (sVar9 == 1) {
    pvVar7 = Var::size(_low_local);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
    if ((*pvVar10 == 1) && ((local_e1 & 1U) != 0)) {
      puVar6 = Var::var_width(_low_local);
      (this->super_Var).var_width_ = *puVar6;
      (this->super_Var).is_packed_ = true;
      goto LAB_0020a8d9;
    }
  }
  if (local_9c == local_a0) {
    pvVar7 = Var::size(_low_local);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if (sVar9 == 1) {
      local_174 = 1;
      local_170 = &local_174;
      local_168 = 1;
      __l._M_len = 1;
      __l._M_array = local_170;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(this->super_Var).size_,__l);
      (this->super_Var).is_packed_ = true;
    }
    else {
      pvVar7 = Var::size(_low_local);
      local_1a0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar7);
      local_198 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator+(&local_1a0,1);
      pvVar7 = Var::size(_low_local);
      local_1a8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar7);
      std::allocator<unsigned_int>::allocator(&local_1a9);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_190,local_198,local_1a8
                 ,&local_1a9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(this->super_Var).size_,&local_190);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_190);
      std::allocator<unsigned_int>::~allocator(&local_1a9);
      iVar3 = (*(_low_local->super_IRNode)._vptr_IRNode[0x18])();
      (this->super_Var).is_packed_ = (bool)((byte)iVar3 & 1);
    }
    puVar6 = Var::var_width(_low_local);
    (this->super_Var).var_width_ = *puVar6;
  }
  else {
    pvVar7 = Var::size(_low_local);
    local_1d0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar7);
    pvVar7 = Var::size(_low_local);
    _base_width = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar7);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 7));
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1c8,local_1d0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )_base_width,(allocator<unsigned_int> *)((long)&i + 7));
    pvVar7 = &(this->super_Var).size_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar7,&local_1c8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c8);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 7));
    iVar3 = local_9c - local_a0;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(pvVar7);
    *pvVar10 = iVar3 + 1;
    puVar6 = Var::var_width(_low_local);
    (this->super_Var).var_width_ = *puVar6;
    iVar3 = (*(_low_local->super_IRNode)._vptr_IRNode[0x18])();
    (this->super_Var).is_packed_ = (bool)((byte)iVar3 & 1);
  }
LAB_0020a8d9:
  VVar4 = Var::type(_low_local);
  if (VVar4 == Slice) {
    if (_low_local == (Var *)0x0) {
      local_3b0 = (long *)0x0;
    }
    else {
      local_3b0 = (long *)__dynamic_cast(_low_local,&Var::typeinfo,&typeinfo,0);
    }
    pvVar7 = Var::size(_low_local);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if (sVar9 == 1) {
      pvVar7 = Var::size(_low_local);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
      uVar5 = local_a0;
      if ((*pvVar10 == 1) && ((local_e1 & 1U) == 0)) {
        iVar3 = (**(code **)(*local_3b0 + 0x130))();
        uVar1 = local_9c;
        this->var_low_ = uVar5 + iVar3;
        iVar3 = (**(code **)(*local_3b0 + 0x130))();
        this->var_high_ = uVar1 + iVar3;
        return;
      }
    }
    pvVar7 = Var::size(_low_local);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if (sVar9 == 1) {
      pvVar7 = Var::size(_low_local);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
      if ((*pvVar10 == 1) && ((local_e1 & 1U) != 0)) {
        uVar5 = (**(code **)(*local_3b0 + 0x130))();
        this->var_low_ = uVar5;
        uVar5 = (**(code **)(*local_3b0 + 0x128))();
        this->var_high_ = uVar5;
        return;
      }
    }
    puVar6 = Var::var_width(_low_local);
    i_1._4_4_ = *puVar6;
    local_200 = 1;
    while( true ) {
      pvVar7 = Var::size(_low_local);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
      if (sVar9 <= local_200) break;
      pvVar7 = Var::size(_low_local);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar7,local_200);
      i_1._4_4_ = *pvVar10 * i_1._4_4_;
      local_200 = local_200 + 1;
    }
    iVar3 = (**(code **)(*local_3b0 + 0x130))();
    this->var_low_ = iVar3 + local_a0 * i_1._4_4_;
    iVar3 = (**(code **)(*local_3b0 + 0x130))();
    this->var_high_ = (iVar3 + (local_9c + 1) * i_1._4_4_) - 1;
  }
  else {
    pvVar7 = Var::size(_low_local);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if (sVar9 == 1) {
      pvVar7 = Var::size(_low_local);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
      if ((*pvVar10 == 1) && (bVar2 = Var::explicit_array(_low_local), bVar2)) {
        this->var_low_ = 0;
        this->var_high_ = (this->super_Var).var_width_ - 1;
        return;
      }
    }
    pvVar7 = Var::size(_low_local);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    if (sVar9 == 1) {
      pvVar7 = Var::size(_low_local);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
      if (*pvVar10 == 1) {
        this->var_low_ = local_a0;
        this->var_high_ = local_9c;
        return;
      }
    }
    puVar6 = Var::var_width(_low_local);
    i._0_4_ = *puVar6;
    slice = (VarSlice *)0x1;
    while( true ) {
      pvVar7 = Var::size(_low_local);
      pVVar11 = (VarSlice *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
      if (pVVar11 <= slice) break;
      pvVar7 = Var::size(_low_local);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar7,(size_type)slice);
      i._0_4_ = *pvVar10 * (uint32_t)i;
      slice = (VarSlice *)((long)&(slice->super_Var).super_IRNode._vptr_IRNode + 1);
    }
    this->var_low_ = local_a0 * (uint32_t)i;
    this->var_high_ = (local_9c + 1) * (uint32_t)i - 1;
  }
  return;
}

Assistant:

VarSlice::VarSlice(Var *parent, uint32_t high, uint32_t low)
    // variable slice is always unsigned based on the spec
    : Var(parent->generator(), "", parent->var_width(), 1, false, VarType::Slice),
      parent_var(parent),
      low(low),
      high(high),
      op_({high, low}) {
    // compute the width
    // notice that if the user has explicit set it to be an array
    // we need to honer their wish
    // we also need to honer the way the dimension the array is set
    auto diff = num_size_decrease(parent);
    auto diff_parent = true;
    if (low == 0 && high == 0 && parent->type() == VarType::Slice) {
        auto p_d = num_size_decrease(reinterpret_cast<VarSlice *>(parent)->parent_var);
        diff_parent = diff != p_d;
    }
    bool dropped_dim_size1 = low == 0 && high == 0 &&
                             parent->get_var_root_parent()->size().size() > 1 &&
                             parent->get_var_root_parent()->size().back() == 1 && diff_parent &&
                             diff == parent->get_var_root_parent()->size().size() - 1;
    if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
        if (high != 0 || low != 0) {
            throw VarException(::format("Parent {0} is a scalar but used marked as an explicit "
                                        "array, only [0, 0] allowed",
                                        parent->to_string()),
                               {parent});
        }
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
        // even it is true, we still need to make sure cases such as
        // [3:0][0:0] declaration (from size = (4, 1)), can be sliced twice before hitting
        // the wire, which means we need to count the number of size decreases
        // this is the actual slice
        var_width_ = high - low + 1;
        is_packed_ = parent->is_packed();
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
        // need to keep the var width calculation correct
        var_width_ = parent->var_width();
        is_packed_ = true;
    } else {
        if (high == low) {
            if (parent->size().size() == 1) {
                size_ = {1};
                is_packed_ = true;
            } else {
                size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
                is_packed_ = parent->is_packed();
            }
            var_width_ = parent->var_width();
        } else {
            // readjust the top slice
            size_ = std::vector<uint32_t>(parent->size().begin(), parent->size().end());
            size_.back() = high - low + 1;
            var_width_ = parent->var_width();
            is_packed_ = parent->is_packed();
        }
    }
    // compute the var high and var_low
    if (parent->type() != VarType::Slice) {
        // use width to compute
        // honer user's wish
        if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
            var_low_ = 0;
            var_high_ = var_width_ - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1) {
            var_low_ = low;
            var_high_ = high;
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = low * base_width;
            var_high_ = (high + 1) * base_width - 1;
        }
    } else {
        // it's a slice
        auto *slice = dynamic_cast<VarSlice *>(parent);
        if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
            var_low_ = low + slice->var_low();
            var_high_ = (high + 1) + slice->var_low() - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
            var_low_ = slice->var_low();
            var_high_ = slice->var_high();
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = slice->var_low() + low * base_width;
            var_high_ = slice->var_low() + (high + 1) * base_width - 1;
        }
    }
}